

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<unsigned_long>(ostream *out,char *fmt,unsigned_long *args)

{
  long lVar1;
  ostream *in_RSI;
  unsigned_long *in_RDI;
  long in_FS_OFFSET;
  FormatListRef in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  makeFormatList<unsigned_long>(in_RDI);
  vformat(in_RSI,(char *)in_RDI,in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}